

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O0

void StartREST(any *context)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  anon_struct_16_2_bf24d843 *up;
  anon_struct_16_2_bf24d843 *__end1;
  anon_struct_16_2_bf24d843 *__begin1;
  anon_struct_16_2_bf24d843 (*__range1) [12];
  anon_class_32_2_05f9280c handler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  any *in_stack_ffffffffffffff40;
  anon_class_32_2_05f9280c *__f;
  function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff58;
  anon_struct_16_2_bf24d843 *paVar1;
  HTTPRequestHandler *handler_00;
  anon_struct_16_2_bf24d843 *prefix;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 local_49 [65];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  prefix = uri_prefixes;
  paVar1 = uri_prefixes;
  while (paVar1 != (anon_struct_16_2_bf24d843 *)&StartREST(std::any_const&)::$_0::typeinfo) {
    handler_00 = (HTTPRequestHandler *)paVar1;
    std::any::any(in_stack_ffffffffffffff40,(any *)in_stack_ffffffffffffff38);
    local_49._17_8_ =
         *(undefined8 *)&(((HTTPRequestHandler *)paVar1)->super__Function_base)._M_functor;
    local_49._25_8_ =
         *(_func_bool_any_ptr_HTTPRequest_ptr_string_ptr **)
          ((long)&(((HTTPRequestHandler *)paVar1)->super__Function_base)._M_functor + 8);
    __f = (anon_class_32_2_05f9280c *)local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,(char *)prefix,(allocator<char> *)handler_00);
    std::function<bool(HTTPRequest*,std::__cxx11::string_const&)>::
    function<StartREST(std::any_const&)::__0&,void>(in_stack_ffffffffffffff58,__f);
    RegisterHTTPHandler((string *)prefix,(bool)in_stack_ffffffffffffffaf,handler_00);
    std::
    function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)in_stack_ffffffffffffff38);
    std::__cxx11::string::~string(in_stack_ffffffffffffff38);
    std::allocator<char>::~allocator((allocator<char> *)local_49);
    StartREST(std::any_const&)::$_0::~__0((anon_class_32_2_05f9280c *)in_stack_ffffffffffffff38);
    paVar1 = (anon_struct_16_2_bf24d843 *)&(handler_00->super__Function_base)._M_manager;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StartREST(const std::any& context)
{
    for (const auto& up : uri_prefixes) {
        auto handler = [context, up](HTTPRequest* req, const std::string& prefix) { return up.handler(context, req, prefix); };
        RegisterHTTPHandler(up.prefix, false, handler);
    }
}